

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<Fad<long_double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>_>
::dx(FadBinaryMul<Fad<long_double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>_>
     *this,int i)

{
  value_type *pvVar1;
  undefined8 *in_RDI;
  FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe6;
  
  Fad<long_double>::dx
            ((Fad<long_double> *)CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>
  ::val((FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>
         *)0x13601c8);
  FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>
  ::dx(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  pvVar1 = (value_type *)Fad<long_double>::val((Fad<long_double> *)*in_RDI);
  return pvVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}